

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device_ping.cpp
# Opt level: O0

bool __thiscall dev_ping::Impl::getsockaddr(Impl *this,char *host,sockaddr_in *sockaddr)

{
  char cVar1;
  bool bVar2;
  uint32_t uVar3;
  in_addr_t iVar4;
  hostent *phVar5;
  char *pcVar6;
  hostent *hostname;
  char *pcStack_30;
  bool is_ipaddr;
  char *p;
  char c;
  bool rc;
  sockaddr_in *sockaddr_local;
  char *host_local;
  Impl *this_local;
  
  memset(sockaddr,0,8);
  sockaddr->sin_family = 2;
  p._7_1_ = true;
  if ((host == (char *)0x0) || (*host == '\0')) {
    uVar3 = htonl(0);
    (sockaddr->sin_addr).s_addr = uVar3;
  }
  else {
    bVar2 = true;
    pcStack_30 = host;
    do {
      pcVar6 = pcStack_30 + 1;
      cVar1 = *pcStack_30;
      if (cVar1 == '\0') goto LAB_00106104;
      pcStack_30 = pcVar6;
    } while ((cVar1 == '.') || (('/' < cVar1 && (cVar1 < ':'))));
    bVar2 = false;
LAB_00106104:
    if (bVar2) {
      iVar4 = inet_addr(host);
      (sockaddr->sin_addr).s_addr = iVar4;
    }
    else {
      phVar5 = gethostbyname(host);
      p._7_1_ = phVar5 != (hostent *)0x0;
      if (p._7_1_) {
        (sockaddr->sin_addr).s_addr = *(in_addr_t *)*phVar5->h_addr_list;
      }
    }
  }
  return p._7_1_;
}

Assistant:

bool dev_ping::Impl::getsockaddr(const char *host, sockaddr_in *sockaddr)
{
    memset(static_cast<void *>(sockaddr), 0, sizeof(sockaddr));
    sockaddr->sin_family = AF_INET;

    bool rc = true;
    if (host == NULL || host[0] == '\0') {
        sockaddr->sin_addr.s_addr = htonl(INADDR_ANY);
    }
    else {
        char c;
        const char *p = host;
        bool is_ipaddr = true;
        while ((c = (*p++)) != '\0') {
            if ((c != '.') && (!((c >= '0') && (c <= '9')))) {
                is_ipaddr = false;
                break;
            }
        }

        if (is_ipaddr) {
            sockaddr->sin_addr.s_addr = inet_addr(host);
        }
        else {
            struct hostent *hostname = gethostbyname(host);
            if (hostname != NULL) {
                memcpy(&(sockaddr->sin_addr), *(hostname->h_addr_list), sizeof(struct in_addr));
            }
            else {
                rc = false;
            }
        }
    }
    return rc;
}